

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall perfetto::base::UnixSocket::OnEvent(UnixSocket *this)

{
  State SVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  UnixSocket *pUVar5;
  ScopedFile new_fd;
  UnixSocket *local_40;
  ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
  local_38;
  socklen_t err_len;
  
  SVar1 = this->state_;
  if (SVar1 == kConnecting) {
    new_fd.t_ = 0x16;
    err_len = 4;
    iVar3 = getsockopt((this->sock_raw_).fd_.t_,1,4,&new_fd,&err_len);
    if (new_fd.t_ != 0x73 || iVar3 != 0) {
      bVar2 = new_fd.t_ == 0;
      if (iVar3 == 0 && bVar2) {
        if (this->peer_cred_mode_ == kDefault) {
          ReadPeerCredentialsPosix(this);
        }
        this->state_ = kConnected;
      }
      else {
        strerror(new_fd.t_);
        Shutdown(this,false);
      }
      (*this->event_listener_->_vptr_EventListener[3])
                (this->event_listener_,this,(ulong)(iVar3 == 0 && bVar2));
    }
  }
  else {
    if (SVar1 == kConnected) {
      (*this->event_listener_->_vptr_EventListener[5])(this->event_listener_,this);
      return;
    }
    if (SVar1 == kListening) {
LAB_002ef1b2:
      do {
        iVar3 = accept((this->sock_raw_).fd_.t_,(sockaddr *)0x0,(socklen_t *)0x0);
        if (iVar3 == -1) {
          piVar4 = __errno_location();
          if (*piVar4 == 4) goto LAB_002ef1b2;
        }
        new_fd.t_ = iVar3;
        if (iVar3 != -1) {
          pUVar5 = (UnixSocket *)operator_new(0x40);
          new_fd.t_ = -1;
          local_38.t_ = iVar3;
          UnixSocket(pUVar5,this->event_listener_,this->task_runner_,&local_38,kConnected,
                     (this->sock_raw_).family_,(this->sock_raw_).type_,this->peer_cred_mode_);
          ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
          ::reset(&local_38,-1);
          local_40 = pUVar5;
          (*this->event_listener_->_vptr_EventListener[2])(this->event_listener_,this,&local_40);
          pUVar5 = local_40;
          if (local_40 != (UnixSocket *)0x0) {
            ~UnixSocket(local_40);
            operator_delete(pUVar5,0x40);
          }
          local_40 = (UnixSocket *)0x0;
        }
        ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
        ::reset(&new_fd,-1);
      } while (iVar3 != -1);
    }
  }
  return;
}

Assistant:

void UnixSocket::OnEvent() {
  if (state_ == State::kDisconnected)
    return;  // Some spurious event, typically queued just before Shutdown().

  if (state_ == State::kConnected)
    return event_listener_->OnDataAvailable(this);

  if (state_ == State::kConnecting) {
    PERFETTO_DCHECK(sock_raw_);
    int sock_err = EINVAL;
    socklen_t err_len = sizeof(sock_err);
    int res =
        getsockopt(sock_raw_.fd(), SOL_SOCKET, SO_ERROR, &sock_err, &err_len);

    if (res == 0 && sock_err == EINPROGRESS)
      return;  // Not connected yet, just a spurious FD watch wakeup.
    if (res == 0 && sock_err == 0) {
      if (peer_cred_mode_ == SockPeerCredMode::kReadOnConnect)
        ReadPeerCredentialsPosix();
      state_ = State::kConnected;
      return event_listener_->OnConnect(this, true /* connected */);
    }
    PERFETTO_DLOG("Connection error: %s", strerror(sock_err));
    Shutdown(false);
    return event_listener_->OnConnect(this, false /* connected */);
  }

  // New incoming connection.
  if (state_ == State::kListening) {
    // There could be more than one incoming connection behind each FD watch
    // notification. Drain'em all.
    for (;;) {
      ScopedFile new_fd(
          PERFETTO_EINTR(accept(sock_raw_.fd(), nullptr, nullptr)));
      if (!new_fd)
        return;
      std::unique_ptr<UnixSocket> new_sock(new UnixSocket(
          event_listener_, task_runner_, std::move(new_fd), State::kConnected,
          sock_raw_.family(), sock_raw_.type(), peer_cred_mode_));
      event_listener_->OnNewIncomingConnection(this, std::move(new_sock));
    }
  }
}